

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Vector<flatbuffers::Offset64<void>,unsigned_int>,unsigned_int>
          (JsonPrinter *this,uint *param_2,uint param_3,Type *param_4,int param_5,uint8_t *param_6)

{
  char cVar1;
  int iVar2;
  IDLOptions *pIVar3;
  char *pcVar4;
  uint *puVar5;
  uint *val;
  ulong uVar6;
  int iVar7;
  
  cVar1 = '\0';
  if (param_4->base_type == BASE_TYPE_STRUCT) {
    cVar1 = param_4->struct_def->fixed;
  }
  iVar2 = this->opts->indent_step;
  iVar7 = 0;
  if (0 < iVar2) {
    iVar7 = iVar2;
  }
  std::__cxx11::string::push_back((char)this->text);
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  if (param_3 != 0) {
    uVar6 = 0;
    puVar5 = param_2 + 1;
    do {
      if (uVar6 != 0) {
        pIVar3 = this->opts;
        if (pIVar3->protobuf_ascii_alike == false) {
          std::__cxx11::string::push_back((char)this->text);
          pIVar3 = this->opts;
        }
        if (-1 < pIVar3->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this->text,this->text->_M_string_length,0,(char)(iVar7 + param_5));
      if (cVar1 == '\0') {
        if (*param_2 <= uVar6) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<flatbuffers::Offset64<>>::Get(SizeT) const [T = flatbuffers::Offset64<>, SizeT = unsigned int]"
                       );
        }
        val = (uint *)(*(long *)puVar5 + (long)puVar5);
      }
      else {
        val = (uint *)(param_4->struct_def->bytesize * uVar6 + (long)(param_2 + 1));
      }
      pcVar4 = PrintOffset(this,val,param_4,iVar7 + param_5,param_6,(soffset_t)uVar6);
      if (pcVar4 != (char *)0x0) {
        return pcVar4;
      }
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 2;
    } while (param_3 != uVar6);
  }
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)this->text,this->text->_M_string_length,0,(char)param_5);
  std::__cxx11::string::push_back((char)this->text);
  return (char *)0x0;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }